

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  iterator this_00;
  bool bVar1;
  size_type sVar2;
  __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  const_iterator local_50;
  __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
  local_48;
  shared_ptr<cmVariableWatch::Pair> *local_40;
  __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
  local_38;
  iterator it;
  VectorOfPairs *vp;
  void *client_data_local;
  WatchMethod method_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
          ::count(&this->WatchMap,variable);
  if (sVar2 != 0) {
    it._M_current =
         (shared_ptr<cmVariableWatch::Pair> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
         ::operator[](&this->WatchMap,variable);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
    ::__normal_iterator(&local_38);
    local_40 = (shared_ptr<cmVariableWatch::Pair> *)
               std::
               vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
               ::begin((vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
                        *)it._M_current);
    local_38._M_current = local_40;
    while( true ) {
      local_48._M_current =
           (shared_ptr<cmVariableWatch::Pair> *)
           std::
           vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
           ::end((vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
                  *)it._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      p_Var3 = (__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
                  ::operator*(&local_38);
      peVar4 = std::
               __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      if (peVar4->Method == method) {
        if (client_data == (void *)0x0) {
LAB_002d61ea:
          this_00._M_current = it._M_current;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>const*,std::vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>>
          ::__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>*>
                    ((__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>const*,std::vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>>
                      *)&local_50,&local_38);
          std::
          vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
          ::erase((vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
                   *)this_00._M_current,local_50);
          return;
        }
        p_Var3 = (__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
                    ::operator*(&local_38);
        peVar4 = std::
                 __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var3);
        if (client_data == peVar4->ClientData) goto LAB_002d61ea;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method, void* client_data /*=0*/)
{
  if (!this->WatchMap.count(variable)) {
    return;
  }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for (it = vp->begin(); it != vp->end(); ++it) {
    if ((*it)->Method == method &&
        // If client_data is NULL, we want to disconnect all watches against
        // the given method; otherwise match ClientData as well.
        (!client_data || (client_data == (*it)->ClientData))) {
      vp->erase(it);
      return;
    }
  }
}